

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O3

DdNode * Cudd_bddPermute(DdManager *manager,DdNode *node,int *permut)

{
  int *piVar1;
  DdHashTable *table;
  DdNode *pDVar2;
  
  manager->reordered = 0;
  table = cuddHashTableInit(manager,1,2);
  do {
    if (table == (DdHashTable *)0x0) {
      return (DdNode *)0x0;
    }
    pDVar2 = cuddBddPermuteRecur(manager,table,node,permut);
    if (pDVar2 == (DdNode *)0x0) {
      cuddHashTableQuit(table);
      if (manager->reordered != 1) {
        return (DdNode *)0x0;
      }
    }
    else {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      cuddHashTableQuit(table);
      if (manager->reordered != 1) {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar2;
      }
    }
    manager->reordered = 0;
    table = cuddHashTableInit(manager,1,2);
  } while( true );
}

Assistant:

DdNode *
Cudd_bddPermute(
  DdManager * manager,
  DdNode * node,
  int * permut)
{
    DdHashTable         *table;
    DdNode              *res;

    do {
        manager->reordered = 0;
        table = cuddHashTableInit(manager,1,2);
        if (table == NULL) return(NULL);
        res = cuddBddPermuteRecur(manager,table,node,permut);
        if (res != NULL) cuddRef(res);
        /* Dispose of local cache. */
        cuddHashTableQuit(table);

    } while (manager->reordered == 1);

    if (res != NULL) cuddDeref(res);
    return(res);

}